

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

void lws_wsi_mux_sibling_disconnect(lws *wsi)

{
  uint *puVar1;
  lws *plVar2;
  lws **pplVar3;
  lws *plVar4;
  lws **pplVar5;
  
  plVar4 = (wsi->mux).parent_wsi;
  pplVar3 = &(plVar4->mux).child_list;
  do {
    pplVar5 = pplVar3;
    plVar2 = *pplVar5;
    if (plVar2 == (lws *)0x0) goto LAB_001169a5;
    pplVar3 = &(plVar2->mux).sibling_list;
  } while (plVar2 != wsi);
  plVar4 = *pplVar3;
  *pplVar3 = (lws *)0x0;
  *pplVar5 = plVar4;
  _lws_log(0x10,"  %p disentangled from sibling %p\n",wsi);
  plVar4 = (wsi->mux).parent_wsi;
LAB_001169a5:
  puVar1 = &(plVar4->mux).child_count;
  *puVar1 = *puVar1 - 1;
  (wsi->mux).parent_wsi = (lws *)0x0;
  return;
}

Assistant:

void
lws_wsi_mux_sibling_disconnect(struct lws *wsi)
{
	struct lws *wsi2;

	lws_start_foreach_llp(struct lws **, w,
			      wsi->mux.parent_wsi->mux.child_list) {

		/* disconnect from siblings */
		if (*w == wsi) {
			wsi2 = (*w)->mux.sibling_list;
			(*w)->mux.sibling_list = NULL;
			*w = wsi2;
			lwsl_debug("  %p disentangled from sibling %p\n",
				  wsi, wsi2);
			break;
		}
	} lws_end_foreach_llp(w, mux.sibling_list);
	wsi->mux.parent_wsi->mux.child_count--;

	wsi->mux.parent_wsi = NULL;
}